

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.c++
# Opt level: O0

Exception * kj::getCaughtExceptionAsKj(void)

{
  type_info *this;
  char *name;
  Exception *in_RDI;
  Exception *e;
  CanceledException anon_var_0;
  bad_alloc *e_1;
  exception *e_2;
  CleanShutdownException anon_var_0_1;
  
  __cxa_rethrow();
  this = (type_info *)__cxa_current_exception_type();
  name = std::type_info::name(this);
  demangleTypeName(&in_RDI->ownFile,name);
  return in_RDI;
}

Assistant:

kj::Exception getCaughtExceptionAsKj() {
  try {
    throw;
  } catch (Exception& e) {
    e.truncateCommonTrace();
    return kj::mv(e);
  } catch (CanceledException) {
    throw;
  } catch (std::bad_alloc& e) {
    return Exception(Exception::Type::OVERLOADED,
                     "(unknown)", -1, str("std::bad_alloc: ", e.what()));
  } catch (std::exception& e) {
    return Exception(Exception::Type::FAILED,
                     "(unknown)", -1, str("std::exception: ", e.what()));
  } catch (TopLevelProcessContext::CleanShutdownException) {
    throw;
  } catch (...) {
#if __GNUC__ && !KJ_NO_RTTI
    return Exception(Exception::Type::FAILED, "(unknown)", -1, str(
        "unknown non-KJ exception of type: ", getCaughtExceptionType()));
#else
    return Exception(Exception::Type::FAILED, "(unknown)", -1, str("unknown non-KJ exception"));
#endif
  }
}